

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

void __thiscall mp::NLFeeder_Easy::FillObjNonzeros(NLFeeder_Easy *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  uint uVar1;
  double *pdVar2;
  _Bit_type *p_Var3;
  size_t *psVar4;
  int *piVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *puVar8;
  size_t pos_end;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  double dVar15;
  double dVar16;
  
  this_00 = &this->obj_grad_supp_;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,(long)(this->nlme_).vars_.num_col_,false)
  ;
  pdVar2 = (this->nlme_).obj_c_;
  if ((pdVar2 != (double *)0x0) && (uVar7 = (ulong)(this->nlme_).vars_.num_col_, uVar7 != 0)) {
    p_Var3 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      uVar7 = uVar7 - 1;
      iVar10 = (int)uVar7;
      iVar12 = iVar10 + 0x3f;
      if (-1 < iVar10) {
        iVar12 = iVar10;
      }
      iVar12 = iVar12 >> 6;
      uVar13 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
      uVar11 = 1L << ((byte)uVar7 & 0x3f);
      dVar15 = pdVar2[uVar7];
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        uVar11 = uVar11 | p_Var3[(long)iVar12 + uVar13 + 0xffffffffffffffff];
      }
      else {
        uVar11 = ~uVar11 & p_Var3[(long)iVar12 + uVar13 + 0xffffffffffffffff];
      }
      p_Var3[(long)iVar12 + uVar13 + 0xffffffffffffffff] = uVar11;
    } while (uVar7 != 0);
  }
  sVar9 = (this->nlme_).Q_.num_nz_;
  if ((sVar9 != 0) && (uVar7 = (ulong)(this->nlme_).vars_.num_col_, uVar7 != 0)) {
    psVar4 = (this->nlme_).Q_.start_;
    piVar5 = (this->nlme_).Q_.index_;
    p_Var3 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      sVar14 = psVar4[uVar7 - 1];
      uVar11 = uVar7 - 1;
      if (sVar14 != sVar9) {
        uVar7 = uVar7 + 0x3e;
        if (-1 < (long)uVar11) {
          uVar7 = uVar11;
        }
        do {
          puVar8 = p_Var3 + ((long)uVar7 >> 6) +
                            (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) +
                            0xffffffffffffffff;
          *puVar8 = *puVar8 | 1L << ((byte)uVar11 & 0x3f);
          iVar10 = piVar5[sVar14];
          iVar12 = iVar10 + 0x3f;
          if (-1 < (long)iVar10) {
            iVar12 = iVar10;
          }
          puVar8 = p_Var3 + (long)(iVar12 >> 6) +
                            (ulong)(((long)iVar10 & 0x800000000000003fU) < 0x8000000000000001) +
                            0xffffffffffffffff;
          *puVar8 = *puVar8 | 1L << ((byte)iVar10 & 0x3f);
          sVar14 = sVar14 + 1;
        } while (sVar9 != sVar14);
        sVar9 = psVar4[uVar11];
      }
      uVar7 = uVar11;
    } while (uVar11 != 0);
  }
  puVar8 = (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar6 = (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  uVar7 = 0;
  if (uVar1 != 0 || puVar8 != puVar6) {
    dVar15 = 0.0;
    uVar11 = 0;
    do {
      dVar16 = 1.0;
      if ((*puVar8 >> (uVar11 & 0x3f) & 1) == 0) {
        dVar16 = 0.0;
      }
      dVar15 = dVar15 + dVar16;
      iVar10 = (int)uVar11;
      puVar8 = puVar8 + (iVar10 == 0x3f);
      uVar11 = (ulong)(iVar10 + 1);
      if (iVar10 == 0x3f) {
        uVar11 = uVar7;
      }
    } while ((uint)uVar11 != uVar1 || puVar8 != puVar6);
    uVar7 = (long)(dVar15 - 9.223372036854776e+18) & (long)dVar15 >> 0x3f | (long)dVar15;
  }
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros = uVar7;
  return;
}

Assistant:

void FillObjNonzeros() {
    obj_grad_supp_.resize(NLME().NumCols());
    // Linear part -- if provided
    if (NLME().ObjCoefficients()) {
      for (auto i=NLME().NumCols(); i--; )
        obj_grad_supp_[i] = (NLME().ObjCoefficients()[i]);
    }
    // QP part
    auto Q = NLME().Hessian();
    if (Q.num_nz_) {
      assert(Q.num_colrow_ == NLME().NumCols());
      auto pos_end = Q.num_nz_;
      for (auto i=NLME().NumCols(); i--; ) {
        for (auto pos=Q.start_[i]; pos!=pos_end; ++pos) {
          obj_grad_supp_[i] = true;             // x
          obj_grad_supp_[Q.index_[pos]] = true; // y
        }
        pos_end = Q.start_[i];
      }
    }
    header_.num_obj_nonzeros
        = std::accumulate(obj_grad_supp_.begin(),
                          obj_grad_supp_.end(), 0.0);
  }